

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int https_file_open(char *filename,int rwmode,int *handle)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_4f8 [8];
  curlmembuf inmem;
  char errStr [1200];
  int local_2c;
  int flen;
  int ii;
  int *handle_local;
  int rwmode_local;
  char *filename_local;
  
  iVar1 = strncmp(netoutfile,"mem:",4);
  if (iVar1 == 0) {
    filename_local._4_4_ = https_open(filename,0,handle);
  }
  else {
    sVar2 = strlen(netoutfile);
    if ((int)sVar2 == 0) {
      ffpmsg("Output file not set, shouldn\'t have happened (https_file_open)");
      filename_local._4_4_ = 0x68;
    }
    else {
      local_4f8 = (undefined1  [8])0x0;
      inmem.memory = (char *)0x0;
      iVar1 = _setjmp((__jmp_buf_tag *)env);
      if (iVar1 == 0) {
        signal(0xe,signal_handler);
        alarm(net_timeout);
        iVar1 = https_open_network(filename,(curlmembuf *)local_4f8);
        if (iVar1 == 0) {
          alarm(0);
          signal(0xe,(__sighandler_t)0x0);
          if (netoutfile[0] == '!') {
            for (local_2c = 0; local_2c < (int)sVar2; local_2c = local_2c + 1) {
              netoutfile[local_2c] = netoutfile[local_2c + 1];
            }
            file_remove(netoutfile);
          }
          iVar1 = file_create(netoutfile,handle);
          if (iVar1 == 0) {
            if ((ulong)inmem.memory % 0xb40 != 0) {
              snprintf((char *)&inmem.size,0x4b0,
                       "Content-Length not a multiple of 2880 (https_file_open) %zu",inmem.memory);
              ffpmsg((char *)&inmem.size);
            }
            iVar1 = file_write(*handle,(void *)local_4f8,(long)inmem.memory);
            if (iVar1 == 0) {
              free((void *)local_4f8);
              file_close(*handle);
              filename_local._4_4_ = file_open(netoutfile,rwmode,handle);
            }
            else {
              ffpmsg("Error copying https file to disk file (https_file_open)");
              ffpmsg(filename);
              ffpmsg(netoutfile);
              free((void *)local_4f8);
              file_close(*handle);
              filename_local._4_4_ = 0x68;
            }
          }
          else {
            ffpmsg("Unable to create output file (https_file_open)");
            ffpmsg(netoutfile);
            free((void *)local_4f8);
            filename_local._4_4_ = 0x68;
          }
        }
        else {
          alarm(0);
          signal(0xe,(__sighandler_t)0x0);
          ffpmsg("Unable to read https file into memory (https_file_open)");
          free((void *)local_4f8);
          filename_local._4_4_ = 0x68;
        }
      }
      else {
        alarm(0);
        signal(0xe,(__sighandler_t)0x0);
        ffpmsg("Timeout (https_file_open)");
        snprintf((char *)&inmem.size,0x4b0,"Download timeout exceeded: %d seconds",
                 (ulong)net_timeout);
        ffpmsg((char *)&inmem.size);
        ffpmsg("   Timeout may be adjusted with fits_set_timeout");
        free((void *)local_4f8);
        filename_local._4_4_ = 0x68;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

int https_file_open(char *filename, int rwmode, int *handle)
{
  int ii, flen;
  char errStr[MAXLEN];
  curlmembuf inmem;
  
  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( https_open(filename, READONLY, handle) );
  }     

  flen = strlen(netoutfile);
  if (!flen)
  {
      /* cfileio made a mistake, we need to know where to write the file */
      ffpmsg("Output file not set, shouldn't have happened (https_file_open)");
      return (FILE_NOT_OPENED);
  }
  
  inmem.memory=0;
  inmem.size=0;
  if (setjmp(env) != 0)
  {
     alarm(0);
     signal(SIGALRM, SIG_DFL);
     ffpmsg("Timeout (https_file_open)");
     snprintf(errStr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
     ffpmsg(errStr);
     ffpmsg("   Timeout may be adjusted with fits_set_timeout");
     free(inmem.memory);
     return (FILE_NOT_OPENED);
  }
  signal(SIGALRM, signal_handler);
  alarm(net_timeout);
  if (https_open_network(filename, &inmem))
  {
     alarm(0);
     signal(SIGALRM, SIG_DFL);
     ffpmsg("Unable to read https file into memory (https_file_open)");
     free(inmem.memory);
     return (FILE_NOT_OPENED);  
  }
  alarm(0);
  signal(SIGALRM, SIG_DFL);
  
  if (*netoutfile == '!')
  {
     /* user wants to clobber disk file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     file_remove(netoutfile);
  }

  /* Create the output file */
  if (file_create(netoutfile,handle)) 
  {
    ffpmsg("Unable to create output file (https_file_open)");
    ffpmsg(netoutfile);
    free(inmem.memory);
    return (FILE_NOT_OPENED);
  }
    
  if (inmem.size % 2880)
  {
    snprintf(errStr, MAXLEN,
	    "Content-Length not a multiple of 2880 (https_file_open) %zu",
	    inmem.size);
    ffpmsg(errStr);
  }
   
  if (file_write(*handle, inmem.memory, inmem.size))
  {
     ffpmsg("Error copying https file to disk file (https_file_open)");
     ffpmsg(filename);
     ffpmsg(netoutfile);
     free(inmem.memory);
     file_close(*handle);
     return (FILE_NOT_OPENED);
  }
  free(inmem.memory); 
  file_close(*handle);
     
  return file_open(netoutfile, rwmode, handle);
}